

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O0

void iutest::detail::iuUniversalPrinter<int[3]>::Print(int (*a) [3],iu_ostream *os)

{
  iu_ostream *os_local;
  int (*a_local) [3];
  
  UniversalPrintArray<int>(*a,3,os);
  return;
}

Assistant:

static void Print(const T(&a)[SIZE], iu_ostream* os)
    {
        UniversalPrintArray(a, SIZE, os);
    }